

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateScatterLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  uint32_t uVar3;
  pointer pcVar4;
  Rep *pRVar5;
  long lVar6;
  bool bVar7;
  Type *pTVar8;
  long *plVar9;
  size_type *psVar10;
  Result *_result;
  string err;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,3,3);
  bVar7 = Result::good(__return_storage_ptr__);
  if (!bVar7) {
    return __return_storage_ptr__;
  }
  pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar7 = Result::good(__return_storage_ptr__);
  if (!bVar7) {
    return __return_storage_ptr__;
  }
  pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  if (this->ndArrayInterpretation != true) goto LAB_0034bdd5;
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  iVar2 = (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
  bVar7 = true;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  if (iVar2 < 1) goto LAB_0034bdb9;
  if (iVar2 == 3) {
    pRVar5 = (layer->inputtensor_).super_RepeatedPtrFieldBase.rep_;
    if (*(int *)((long)pRVar5->elements[0] + 0x24) != *(int *)((long)pRVar5->elements[2] + 0x24)) {
LAB_0034bc74:
      plVar9 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      lVar6 = *plVar9;
      std::__cxx11::string::_M_construct<char*>((string *)&local_90,lVar6,plVar9[1] + lVar6);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x3c0b72);
      psVar10 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_70.field_2._M_allocated_capacity = *psVar10;
        local_70.field_2._8_8_ = plVar9[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar10;
        local_70._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_70._M_string_length = plVar9[1];
      *plVar9 = (long)psVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
      psVar10 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_b0.field_2._M_allocated_capacity = *psVar10;
        local_b0.field_2._8_8_ = plVar9[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar10;
        local_b0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_b0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_50,(string *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_0034bd81:
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
LAB_0034bd8e:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_50);
      goto LAB_0034bdb7;
    }
    pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                       (&(layer->inputtensor_).super_RepeatedPtrFieldBase,1);
    if (pTVar8->rank_ != 1) goto LAB_0034bc74;
    if ((0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) &&
       (iVar2 = (layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_, 0 < iVar2)) {
      if (iVar2 != 1) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Scatter layer must have 1 output tensor fields filled","");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_b0);
        goto LAB_0034bc54;
      }
      pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                         (&(layer->inputtensor_).super_RepeatedPtrFieldBase,0);
      uVar3 = pTVar8->rank_;
      pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                         (&(layer->outputtensor_).super_RepeatedPtrFieldBase,0);
      if (uVar3 == pTVar8->rank_) goto LAB_0034bdb9;
      plVar9 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      lVar6 = *plVar9;
      std::__cxx11::string::_M_construct<char*>((string *)&local_90,lVar6,plVar9[1] + lVar6);
      std::operator+(&local_70,"Output rank of Scatter layer \'",&local_90);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
      psVar10 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_b0.field_2._M_allocated_capacity = *psVar10;
        local_b0.field_2._8_8_ = plVar9[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar10;
        local_b0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_b0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_50,(string *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_0034bd81;
      goto LAB_0034bd8e;
    }
  }
  else {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Scatter layer must have 3 input tensor fields filled","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_b0);
LAB_0034bc54:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
LAB_0034bdb7:
    bVar7 = false;
  }
LAB_0034bdb9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if (!bVar7) {
    return __return_storage_ptr__;
  }
LAB_0034bdd5:
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateScatterLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 3, 3));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        std::string err;
        if (layer.inputtensor_size() > 0) {
            if (layer.inputtensor_size() != 3) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Scatter layer must have 3 input tensor fields filled");
            }
            if (!(layer.inputtensor(0).rank() == layer.inputtensor(2).rank() &&
                  layer.inputtensor(1).rank() == 1)) {
                err = "Input ranks of Scatter layer '" + std::string(layer.name()) + "' are invalid.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
        if (layer.inputtensor_size() > 0 && layer.outputtensor_size() > 0) {
            if (layer.outputtensor_size() != 1) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Scatter layer must have 1 output tensor fields filled");
            }
            if (!(layer.inputtensor(0).rank() == layer.outputtensor(0).rank())) {
                err = "Output rank of Scatter layer '" + std::string(layer.name()) + "' does not match container input.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
    }

    return Result();
}